

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_binding.hpp
# Opt level: O2

istream * shadow::serialization_detail::serialization_type_selector<bool,_void>::
          deserialize_dispatch(istream *in,any *value)

{
  __type _Var1;
  holder_base *phVar2;
  string boolstring;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  std::operator>>(in,(string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"true",&local_69);
  _Var1 = std::operator==(&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  phVar2 = (holder_base *)((long)&value->field_1 + 8);
  if (value->on_heap_ != false) {
    phVar2 = (value->field_1).heap + 1;
  }
  *(__type *)&phVar2->_vptr_holder_base = _Var1;
  std::__cxx11::string::~string((string *)&local_68);
  return in;
}

Assistant:

static std::istream&
    deserialize_dispatch(std::istream& in, any& value)
    {
        std::string boolstring;

        in >> boolstring;

        if(boolstring == std::string("true"))
        {
            value.get<bool>() = true;
        }
        else
        {
            value.get<bool>() = false;
        }

        return in;
    }